

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolDefinitionInlining.cpp
# Opt level: O0

void __thiscall
SymbolDefinitionInlining::collectBoundVariables(SymbolDefinitionInlining *this,Formula *formula)

{
  bool bVar1;
  Connective CVar2;
  VList *l;
  FormulaList *l_00;
  SymbolDefinitionInlining *in_RSI;
  TermList in_RDI;
  Term *in_stack_00000018;
  Iterator fit;
  Iterator vit;
  SymbolDefinitionInlining *in_stack_ffffffffffffffb8;
  Iterator local_28 [2];
  Iterator in_stack_ffffffffffffffe8;
  
  CVar2 = Kernel::Formula::connective((Formula *)in_RSI);
  switch(CVar2) {
  case LITERAL:
    Kernel::Formula::literal((Formula *)0xd08f4f);
    collectBoundVariables((SymbolDefinitionInlining *)fit._lst,in_stack_00000018);
    break;
  case AND:
  case OR:
    l_00 = Kernel::Formula::args((Formula *)0xd08ea1);
    Lib::List<Kernel::Formula_*>::Iterator::Iterator(local_28,l_00);
    while (bVar1 = Lib::List<Kernel::Formula_*>::Iterator::hasNext((Iterator *)0xd08eb8), bVar1) {
      Lib::List<Kernel::Formula_*>::Iterator::next((Iterator *)in_RDI._content);
      collectBoundVariables(in_RSI,(Formula *)in_stack_ffffffffffffffe8._lst);
    }
    break;
  case IMP:
  case IFF:
  case XOR:
    Kernel::Formula::left((Formula *)0xd08eff);
    collectBoundVariables(in_RSI,(Formula *)in_stack_ffffffffffffffe8._lst);
    Kernel::Formula::right((Formula *)0xd08f16);
    collectBoundVariables(in_RSI,(Formula *)in_stack_ffffffffffffffe8._lst);
    break;
  case NOT:
    Kernel::Formula::uarg((Formula *)0xd08ee6);
    collectBoundVariables(in_RSI,(Formula *)in_stack_ffffffffffffffe8._lst);
    break;
  case FORALL:
  case EXISTS:
    Kernel::Formula::qarg((Formula *)0xd08e51);
    collectBoundVariables(in_RSI,(Formula *)in_stack_ffffffffffffffe8._lst);
    l = Kernel::Formula::vars((Formula *)0xd08e68);
    Lib::List<unsigned_int>::Iterator::Iterator((Iterator *)&stack0xffffffffffffffe8,l);
    Lib::List<unsigned_int>::pushFromIterator<Lib::List<unsigned_int>::Iterator>
              ((Iterator)in_RDI._content,(List<unsigned_int> **)in_stack_ffffffffffffffb8);
    break;
  case BOOL_TERM:
    Kernel::Formula::getBooleanTerm((Formula *)in_stack_ffffffffffffffb8);
    collectBoundVariables(in_stack_ffffffffffffffb8,in_RDI);
  }
  return;
}

Assistant:

void SymbolDefinitionInlining::collectBoundVariables(Formula* formula) {
  switch (formula->connective()) {
    case FORALL:
    case EXISTS: {
      collectBoundVariables(formula->qarg());
      VList::Iterator vit(formula->vars());
      VList::pushFromIterator(vit, _bound);
      break;
    }

    case AND:
    case OR: {
      List<Formula*>::Iterator fit(formula->args());
      while (fit.hasNext()) {
        collectBoundVariables(fit.next());
      }
      break;
    }

    case NOT: {
      collectBoundVariables(formula->uarg());
      break;
    }

    case IMP:
    case IFF:
    case XOR: {
      collectBoundVariables(formula->left());
      collectBoundVariables(formula->right());
      break;
    }

    case BOOL_TERM: {
      collectBoundVariables(formula->getBooleanTerm());
      break;
    }

    case LITERAL: {
      collectBoundVariables(formula->literal());
      break;
    }

    default:
      break;
  }
}